

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O1

string * __thiscall
glcts::TextureBufferTextureBufferRange::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  stringstream result;
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar5 = info->m_output_type & 0xfffffffe;
  pcVar6 = fixed_sample_locations_values + 1;
  if (uVar5 == 0x1404) {
    pcVar6 = "flat ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp ",
             0x4d);
  local_218[0] = local_208;
  pcVar1 = (info->m_sampler_type_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar1,pcVar1 + (info->m_sampler_type_name)._M_string_length);
  plVar3 = local_218[0];
  iVar2 = (int)(ostream *)local_1a8;
  if (local_218[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_218[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             " sampler_buffer;\n\nlayout(location = 0 ) out flat int outTextureSize;\nlayout(location = 1 ) out "
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar6,(ulong)(uVar5 == 0x1404) * 5);
  pcVar1 = (info->m_output_type_name)._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar1,pcVar1 + (info->m_output_type_name)._M_string_length);
  plVar3 = local_1d8[0];
  if (local_1d8[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_1d8[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             " outValue;\nvoid main(void)\n{\n    outValue       = texelFetch ( sampler_buffer, 0)",
             0x51);
  pcVar1 = (info->m_value_selector)._M_dataplus._M_p;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar1,pcVar1 + (info->m_value_selector)._M_string_length);
  plVar3 = local_1f8[0];
  if (local_1f8[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_1f8[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             ";\n    outTextureSize = textureSize( sampler_buffer );\n    gl_Position    = vec4(0.0f, 0.0f, 0.0f, 0.0f);\n}\n"
             ,0x6b);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getVertexShaderCode(FormatInfo& info) const
{
	std::stringstream result;

	const char* pszInterpolationQualifier = "";

	if (info.get_output_type() == GL_UNSIGNED_INT || info.get_output_type() == GL_INT)
	{
		pszInterpolationQualifier = "flat ";
	}

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "uniform highp "
		   << info.get_sampler_type_name().c_str() << " sampler_buffer;\n"
													  "\n"
													  "layout(location = 0 ) out flat int outTextureSize;\n"
													  "layout(location = 1 ) out "
		   << pszInterpolationQualifier << info.get_output_type_name().c_str()
		   << " outValue;\n"
			  "void main(void)\n"
			  "{\n"
			  "    outValue       = texelFetch ( sampler_buffer, 0)"
		   << info.get_value_selector().c_str() << ";\n"
												   "    outTextureSize = textureSize( sampler_buffer );\n"
												   "    gl_Position    = vec4(0.0f, 0.0f, 0.0f, 0.0f);\n"
												   "}\n";

	return result.str();
}